

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O1

int CheckFromArray(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int cost;
  int weight;
  int knapsackCost;
  uint local_3c;
  uint local_38;
  int local_34;
  
  stream.Out = (FILE *)fopen("out.txt","r");
  if ((FILE *)stream.Out == (FILE *)0x0) {
    puts("can\'t open out.txt");
    currentTest = currentTest + 1;
    iVar1 = -1;
  }
  else {
    local_34 = 0;
    pcVar2 = ScanInt(stream.Out,&local_34);
    iVar1 = 1;
    if (pcVar2 == "PASSED") {
      if (local_34 == TestData.Tests[currentTest].KnapsackCost) {
        uVar5 = 0;
        local_38 = 0;
        local_3c = 0;
        iVar1 = __isoc99_fscanf(stream.Out,"%d %d");
        if (iVar1 == 2) {
          lVar4 = 0x10336c;
          uVar5 = 0;
          do {
            lVar3 = currentTest * 0x478;
            if (TestData.Tests[currentTest].CountResultItems <= uVar5) {
              pcVar2 = "Output too long -- failed";
              goto LAB_001025ac;
            }
            if ((*(uint *)(lVar4 + -4 + lVar3) != local_38) ||
               (*(uint *)(lVar4 + lVar3) != local_3c)) {
              printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n",
                     (ulong)local_38,(ulong)local_3c,(ulong)*(uint *)(lVar4 + -4 + lVar3),
                     (ulong)*(uint *)(lVar4 + lVar3));
              goto LAB_001025b1;
            }
            uVar5 = uVar5 + 1;
            iVar1 = __isoc99_fscanf(stream.Out,"%d %d",&local_38,&local_3c);
            lVar4 = lVar4 + 8;
          } while (iVar1 == 2);
        }
        if (uVar5 < TestData.Tests[currentTest].CountResultItems) {
          pcVar2 = "Output too short -- Failed";
LAB_001025ac:
          puts(pcVar2);
LAB_001025b1:
          iVar1 = 1;
        }
        else {
          puts("PASSED");
          currentTest = currentTest + 1;
          fclose((FILE *)stream.Out);
          iVar1 = 0;
        }
      }
      else {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n");
      }
    }
  }
  return iVar1;
}

Assistant:

static int CheckFromArray(void) {
    stream.Out = fopen("out.txt", "r");
    if (!stream.Out) {
        printf("can't open out.txt\n");
        currentTest++;
        return -1;
    }
    int knapsackCost = 0;
    const char* result = ScanInt(stream.Out, &knapsackCost);
    if (result != Pass) {
        return 1;
    }
    if (knapsackCost != TestData.Tests[currentTest].KnapsackCost) {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n", knapsackCost, TestData.Tests[currentTest].KnapsackCost);
        return 1;
    }
    
    int weight = 0, cost = 0;
    size_t readItemsCount = 0;
    while(fscanf(stream.Out, "%d %d", &weight, &cost) == 2) {
        if (readItemsCount >= TestData.Tests[currentTest].CountResultItems) {
            printf("Output too long -- failed\n");
            return 1;
        }
        if (TestData.Tests[currentTest].Result[readItemsCount].Weight != weight || TestData.Tests[currentTest].Result[readItemsCount].Cost != cost) {
            printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n", weight, cost, TestData.Tests[currentTest].Result[readItemsCount].Weight, TestData.Tests[currentTest].Result[readItemsCount].Cost);
            return 1;
        }
        ++readItemsCount;
    }
    if (readItemsCount < TestData.Tests[currentTest].CountResultItems) {
        printf("Output too short -- Failed\n");
        return 1;
    }
    printf("PASSED\n");
    ++currentTest;
    fclose(stream.Out);
    return 0;
}